

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_option_usage_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  bool bVar1;
  uint uVar2;
  uint __val;
  long lVar3;
  uint uVar4;
  ostream *poVar5;
  long *plVar6;
  uint uVar7;
  long *plVar8;
  size_type *psVar9;
  ulong uVar10;
  uint __len;
  stringstream out;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])(&local_1f8,this,opt,1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1f8,local_1f0);
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,local_1e8 + 1);
  }
  if (opt->expected_ < 2) {
    if (opt->expected_ < 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"...",3);
    }
  }
  else {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(",1);
    uVar2 = opt->expected_;
    __val = -uVar2;
    if (0 < (int)uVar2) {
      __val = uVar2;
    }
    __len = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar7 = (uint)uVar10;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_0017d894;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_0017d894;
        }
        if (uVar7 < 10000) goto LAB_0017d894;
        uVar10 = uVar10 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_0017d894:
    local_1f8 = &local_1e8;
    ::std::__cxx11::string::_M_construct((ulong)&local_1f8,(char)__len - (char)((int)uVar2 >> 0x1f))
    ;
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_1f8 + (ulong)(uVar2 >> 0x1f)),__len,__val);
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_1f8,local_1f0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"x)",2);
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
  }
  bVar1 = (opt->super_OptionBase<CLI::Option>).required_;
  if (bVar1 == true) {
    ::std::__cxx11::stringbuf::str();
  }
  else {
    ::std::__cxx11::stringbuf::str();
    plVar6 = (long *)::std::__cxx11::string::replace((ulong)local_1d8,0,(char *)0x0,0x1b15e5);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_1e8 = *plVar8;
      lStack_1e0 = plVar6[3];
      local_1f8 = &local_1e8;
    }
    else {
      local_1e8 = *plVar8;
      local_1f8 = (long *)*plVar6;
    }
    local_1f0 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_1f8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
  }
  if (bVar1 == false) {
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0],local_1c8[0] + 1);
    }
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_option_usage(const Option *opt) const {
    // Note that these are positionals usages
    std::stringstream out;
    out << make_option_name(opt, true);

    if(opt->get_expected() > 1)
        out << "(" << std::to_string(opt->get_expected()) << "x)";
    else if(opt->get_expected() < 0)
        out << "...";

    return opt->get_required() ? out.str() : "[" + out.str() + "]";
}